

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_line_container.cpp
# Opt level: O3

void __thiscall LineContainer::add(LineContainer *this,ll k,ll m)

{
  pointer *ppLVar1;
  ll lVar2;
  Line *pLVar3;
  iterator __position;
  undefined1 auStack_30 [8];
  Line a;
  
  a.m = 100000000000000000;
  pLVar3 = (this->super_vector<Line,_std::allocator<Line>_>).
           super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->super_vector<Line,_std::allocator<Line>_>).
       super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish;
  auStack_30 = (undefined1  [8])k;
  a.k = m;
  if (pLVar3 != __position._M_current) {
    do {
      lVar2 = isect(this,(Line *)auStack_30,__position._M_current + -1);
      pLVar3 = (this->super_vector<Line,_std::allocator<Line>_>).
               super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
               _M_start;
      __position._M_current =
           (this->super_vector<Line,_std::allocator<Line>_>).
           super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      if (__position._M_current[-1].p < lVar2) break;
      __position._M_current = __position._M_current + -1;
      (this->super_vector<Line,_std::allocator<Line>_>).
      super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish =
           __position._M_current;
    } while (pLVar3 != __position._M_current);
  }
  if (pLVar3 == __position._M_current) {
    a.m = -100000000000000000;
  }
  else {
    a.m = isect(this,(Line *)auStack_30,__position._M_current + -1);
    __position._M_current =
         (this->super_vector<Line,_std::allocator<Line>_>).
         super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data._M_finish;
  }
  if (__position._M_current ==
      (this->super_vector<Line,_std::allocator<Line>_>).
      super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Line,std::allocator<Line>>::_M_realloc_insert<Line_const&>
              ((vector<Line,std::allocator<Line>> *)this,__position,(Line *)auStack_30);
  }
  else {
    (__position._M_current)->p = a.m;
    (__position._M_current)->k = (ll)auStack_30;
    (__position._M_current)->m = a.k;
    ppLVar1 = &(this->super_vector<Line,_std::allocator<Line>_>).
               super__Vector_base<Line,_std::allocator<Line>_>._M_impl.super__Vector_impl_data.
               _M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  return;
}

Assistant:

void add(ll k, ll m) {
        Line a = {k,m,INF};
        while(!empty() && isect(a, back()) <= back().p) pop_back();
        a.p = empty() ? (-INF) : isect(a, back());
        push_back(a);
    }